

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O1

void si9ma::Trie::insert(TrieNode *root,string *str)

{
  size_type sVar1;
  void *__s;
  long lVar2;
  size_type sVar3;
  
  root->pass = root->pass + 1;
  sVar1 = str->_M_string_length;
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      lVar2 = (long)(str->_M_dataplus)._M_p[sVar3];
      if (*(long *)((long)root + lVar2 * 8 + -0x300) == 0) {
        __s = operator_new(0xd8);
        memset(__s,0,0xd8);
        *(void **)((long)root + lVar2 * 8 + -0x300) = __s;
      }
      root = *(TrieNode **)((long)root + lVar2 * 8 + -0x300);
      root->pass = root->pass + 1;
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  root->end = root->end + 1;
  return;
}

Assistant:

void Trie::insert(TrieNode *root,const string &str) {
        root->pass ++;
        auto *cur = root;

        for (int i = 0; i < str.length(); ++i) {
            int index = str[i] - 'a';

            if (cur->nexts[index] == nullptr){
                cur->nexts[index] = new TrieNode(0,0);
            }
            cur->nexts[index]->pass++;
            cur = cur->nexts[index];
        }

        cur->end ++;
    }